

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O1

void __thiscall
ValidationSignals::UpdatedBlockTip
          (ValidationSignals *this,CBlockIndex *pindexNew,CBlockIndex *pindexFork,
          bool fInitialDownload)

{
  uint256 *puVar1;
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar2;
  char *pcVar3;
  bool bVar4;
  Logger *this_00;
  undefined4 uVar5;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 uVar6;
  bool *in_stack_ffffffffffffff10;
  undefined8 *local_e8;
  undefined8 uStack_e0;
  code *local_d8;
  code *pcStack_d0;
  char *local_name;
  bool fInitialDownload_local;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  string local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (undefined4)CONCAT71(in_register_00000009,fInitialDownload);
  local_name = "UpdatedBlockTip";
  fInitialDownload_local = fInitialDownload;
  this_00 = LogInstance();
  bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,VALIDATION,Debug);
  if (bVar4) {
    puVar1 = pindexNew->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
LAB_0043c8a9:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_78 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    uStack_70 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_68 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_60 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    base_blob<256u>::ToString_abi_cxx11_(&local_58,&local_78);
    if (pindexFork == (CBlockIndex *)0x0) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x43c76b;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"null","");
    }
    else {
      puVar1 = pindexFork->phashBlock;
      if (puVar1 == (uint256 *)0x0) goto LAB_0043c8a9;
      local_b8 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      uStack_b0 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_a8 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_a0 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x43c748;
      base_blob<256u>::ToString_abi_cxx11_(&local_98,&local_b8);
    }
    logging_function._M_str = "UpdatedBlockTip";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x60;
    LogPrintf_<char_const*,std::__cxx11::string,std::__cxx11::string,bool>
              (logging_function,source_file,0x850667,(LogFlags)&local_name,(Level)&local_58,
               (char *)&local_98,(char **)&fInitialDownload_local,args_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar5,in_stack_ffffffffffffff08),in_stack_ffffffffffffff10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = fInitialDownload_local;
  pcVar3 = local_name;
  uVar6 = (undefined1)uVar5;
  uVar2._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  local_e8 = (undefined8 *)0x0;
  uStack_e0 = 0;
  local_d8 = (code *)0x0;
  pcStack_d0 = (code *)0x0;
  local_e8 = (undefined8 *)operator_new(0x40);
  *local_e8 = pcVar3;
  local_e8[1] = pindexNew;
  local_e8[2] = pindexFork;
  *(bool *)(local_e8 + 3) = bVar4;
  local_e8[4] = pindexNew;
  local_e8[5] = pindexFork;
  *(undefined1 *)(local_e8 + 6) = uVar6;
  local_e8[7] = this;
  pcStack_d0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp:180:5)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp:180:5)>
             ::_M_manager;
  (**(code **)(*(long *)uVar2._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar2._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl,
                     &local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValidationSignals::UpdatedBlockTip(const CBlockIndex *pindexNew, const CBlockIndex *pindexFork, bool fInitialDownload) {
    // Dependencies exist that require UpdatedBlockTip events to be delivered in the order in which
    // the chain actually updates. One way to ensure this is for the caller to invoke this signal
    // in the same critical section where the chain is updated

    auto event = [pindexNew, pindexFork, fInitialDownload, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.UpdatedBlockTip(pindexNew, pindexFork, fInitialDownload); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: new block hash=%s fork block hash=%s (in IBD=%s)", __func__,
                          pindexNew->GetBlockHash().ToString(),
                          pindexFork ? pindexFork->GetBlockHash().ToString() : "null",
                          fInitialDownload);
}